

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

pair<google::dense_hashtable_iterator<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>,_int,_std::hash<int>,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SelectKey,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>,_bool>
* __thiscall
google::
dense_hashtable<std::pair<int_const,std::unique_ptr<int,std::default_delete<int>>>,int,std::hash<int>,google::dense_hash_map<int,std::unique_ptr<int,std::default_delete<int>>,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::unique_ptr<int,std::default_delete<int>>>>>::SelectKey,google::dense_hash_map<int,std::unique_ptr<int,std::default_delete<int>>,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::unique_ptr<int,std::default_delete<int>>>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::unique_ptr<int,std::default_delete<int>>>>>
::insert_noresize<int,std::pair<int,std::unique_ptr<int,std::default_delete<int>>>>
          (dense_hashtable<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>,_int,_std::hash<int>,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SelectKey,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
           *this,int *key,pair<int,_std::unique_ptr<int,_std::default_delete<int>_>_> *args)

{
  pointer in_RSI;
  pair<google::dense_hashtable_iterator<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>,_int,_std::hash<int>,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SelectKey,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>,_bool>
  *in_RDI;
  pair<unsigned_long,_unsigned_long> pVar1;
  pair<unsigned_long,_unsigned_long> pos;
  pair<google::dense_hashtable_iterator<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>,_int,_std::hash<int>,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SelectKey,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>,_bool>
  *it_end;
  undefined7 in_stack_ffffffffffffff98;
  bool in_stack_ffffffffffffff9f;
  dense_hashtable<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>,_int,_std::hash<int>,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SelectKey,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
  *in_stack_ffffffffffffffa0;
  pointer in_stack_ffffffffffffffa8;
  dense_hashtable<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>,_int,_std::hash<int>,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SelectKey,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
  *in_stack_ffffffffffffffb0;
  bool local_41;
  dense_hashtable<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>,_int,_std::hash<int>,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SelectKey,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
  *in_stack_ffffffffffffffc0;
  pointer in_stack_ffffffffffffffc8;
  dense_hashtable<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>,_int,_std::hash<int>,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SelectKey,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
  *in_stack_ffffffffffffffd0;
  unsigned_long local_28;
  
  it_end = in_RDI;
  pVar1 = dense_hashtable<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>,_int,_std::hash<int>,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SelectKey,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
          ::find_position<int>(in_stack_ffffffffffffffb0,&in_stack_ffffffffffffffa8->first);
  local_28 = pVar1.first;
  if (local_28 == 0xffffffffffffffff) {
    insert_at<std::pair<int,std::unique_ptr<int,std::default_delete<int>>>>
              (in_stack_ffffffffffffffd0,(size_type)in_stack_ffffffffffffffc8,
               (pair<int,_std::unique_ptr<int,_std::default_delete<int>_>_> *)
               in_stack_ffffffffffffffc0);
    std::
    pair<google::dense_hashtable_iterator<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>,_int,_std::hash<int>,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SelectKey,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>,_bool>
    ::
    pair<google::dense_hashtable_iterator<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>,_int,_std::hash<int>,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SelectKey,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>,_bool,_true>
              (in_RDI,(dense_hashtable_iterator<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>,_int,_std::hash<int>,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SelectKey,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
                       *)&stack0xffffffffffffffa0,(bool *)&stack0xffffffffffffff9f);
  }
  else {
    dense_hashtable_iterator<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>,_int,_std::hash<int>,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SelectKey,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
    ::dense_hashtable_iterator
              ((dense_hashtable_iterator<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>,_int,_std::hash<int>,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SelectKey,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
                *)in_stack_ffffffffffffffa0,
               (dense_hashtable<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>,_int,_std::hash<int>,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SelectKey,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
                *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),in_RSI,
               (pointer)it_end,SUB81((ulong)in_RDI >> 0x38,0));
    local_41 = false;
    std::
    pair<google::dense_hashtable_iterator<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>,_int,_std::hash<int>,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SelectKey,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>,_bool>
    ::
    pair<google::dense_hashtable_iterator<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>,_int,_std::hash<int>,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SelectKey,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>,_bool,_true>
              (in_RDI,(dense_hashtable_iterator<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>,_int,_std::hash<int>,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SelectKey,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
                       *)&stack0xffffffffffffffc0,&local_41);
  }
  return it_end;
}

Assistant:

std::pair<iterator, bool> insert_noresize(K&& key, Args&&... args) {
    // First, double-check we're not inserting delkey or emptyval
    assert(settings.use_empty() && "Inserting without empty key");
    assert(!equals(std::forward<K>(key), key_info.empty_key) && "Inserting the empty key");
    assert((!settings.use_deleted() || !equals(key, key_info.delkey)) && "Inserting the deleted key");

    const std::pair<size_type, size_type> pos = find_position(key);
    if (pos.first != ILLEGAL_BUCKET) {  // object was already there
      return std::pair<iterator, bool>(
          iterator(this, table + pos.first, table + num_buckets, false),
          false);  // false: we didn't insert
    } else {       // pos.second says where to put it
      return std::pair<iterator, bool>(insert_at(pos.second, std::forward<Args>(args)...), true);
    }
  }